

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

int refs_resize_help(refs_table_t *tbl)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t *puVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong *puVar8;
  int iVar9;
  ulong *puVar10;
  
  iVar5 = 0;
  if (((0xfffffff < tbl->refs_control) && (iVar5 = 1, -1 < (int)tbl->refs_control)) &&
     (tbl->refs_resize_part < tbl->refs_resize_size >> 7)) {
    LOCK();
    psVar1 = &tbl->refs_resize_part;
    uVar2 = *psVar1;
    *psVar1 = *psVar1 + 1;
    UNLOCK();
    if (uVar2 < tbl->refs_resize_size >> 7) {
      puVar8 = tbl->refs_resize_table + uVar2 * 0x80;
      iVar9 = 0;
      do {
        uVar2 = *puVar8;
        if ((uVar2 != 0) && (uVar2 != 0x7fffffffffffffff)) {
          uVar6 = uVar2 & 0xffffffffff;
          uVar3 = tbl->refs_size;
          puVar4 = tbl->refs_table;
          iVar7 = -0x80;
          uVar6 = ((uVar6 ^ 0xcbf29ce484222325) * 0x100000001b3 ^ (uVar6 >> 0x27 | uVar6 << 0x19)) *
                  0x100000001b3;
          puVar10 = puVar4 + (uVar6 >> 0x20 ^ uVar6) % uVar3;
          do {
            if (*puVar10 == 0) {
              LOCK();
              uVar6 = *puVar10;
              if (uVar6 == 0) {
                *puVar10 = uVar2;
              }
              UNLOCK();
              if (uVar6 == 0) break;
            }
            puVar10 = puVar10 + 1;
            if (puVar10 == puVar4 + uVar3) {
              puVar10 = tbl->refs_table;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0);
        }
        puVar8 = puVar8 + 1;
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x80);
      LOCK();
      tbl->refs_resize_done = tbl->refs_resize_done + 1;
      UNLOCK();
    }
  }
  return iVar5;
}

Assistant:

static int
refs_resize_help(refs_table_t *tbl)
{
    // TODO optimize??
    if (0 == (tbl->refs_control & 0xf0000000)) return 0; // no resize in progress (anymore)
    if (tbl->refs_control & 0x80000000) return 1; // still waiting for preparation

    if (tbl->refs_resize_part >= tbl->refs_resize_size / 128) return 1; // all parts claimed
    size_t part = atomic_fetch_add(&tbl->refs_resize_part, 1);
    if (part >= tbl->refs_resize_size/128) return 1; // all parts claimed

    // rehash all
    int i;
    _Atomic(uint64_t) *bucket = tbl->refs_resize_table + part * 128;
    for (i=0; i<128; i++) {
        refs_rehash(tbl, atomic_load_explicit(bucket, memory_order_relaxed));
        bucket++;
    }

    atomic_fetch_add(&tbl->refs_resize_done, 1);
    return 1;
}